

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Algorithms.cpp
# Opt level: O2

pair<BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger> * __thiscall
Algorithms::mulComplex
          (pair<BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger>
           *__return_storage_ptr__,Algorithms *this,
          pair<BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger> *a,
          pair<BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger> *b,BigInteger *w,
          BigInteger *mod)

{
  BigInteger local_190;
  BigInteger local_170;
  BigInteger local_150;
  BigInteger local_130;
  BigInteger local_110;
  BigInteger local_f0;
  BigInteger local_d0;
  BigInteger local_b0;
  BigInteger local_90;
  BigInteger local_70;
  BigInteger local_50;
  
  BigIntegerLibrary::BigInteger::operator*(&local_b0,&a->first,&b->first);
  BigIntegerLibrary::BigInteger::operator*(&local_f0,&a->second,&b->second);
  BigIntegerLibrary::BigInteger::operator*(&local_d0,&local_f0,w);
  BigIntegerLibrary::BigInteger::operator+(&local_90,&local_b0,&local_d0);
  BigIntegerLibrary::BigInteger::operator+(&local_70,&local_90,mod);
  BigIntegerLibrary::BigInteger::operator%(&local_50,&local_70,mod);
  BigIntegerLibrary::BigInteger::operator*(&local_170,&a->second,&b->first);
  BigIntegerLibrary::BigInteger::operator*(&local_190,&a->first,&b->second);
  BigIntegerLibrary::BigInteger::operator+(&local_150,&local_170,&local_190);
  BigIntegerLibrary::BigInteger::operator+(&local_130,&local_150,mod);
  BigIntegerLibrary::BigInteger::operator%(&local_110,&local_130,mod);
  std::pair<BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger>::
  pair<BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger,_true>
            (__return_storage_ptr__,&local_50,&local_110);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_110);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_130);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_150);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_190);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_170);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_50);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_70);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_90);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_d0);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_f0);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_b0);
  return __return_storage_ptr__;
}

Assistant:

pair<BigInteger, BigInteger>
Algorithms::mulComplex(pair<BigInteger, BigInteger> a, pair<BigInteger, BigInteger> b, BigInteger w, BigInteger mod) {
    return {(a.first * b.first + a.second * b.second * w + mod) % mod, (a.second * b.first + a.first * b.second + mod) % mod};
}